

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

fy_eventp * fy_parse_empty_scalar(fy_parser *fyp)

{
  fy_eventp *pfVar1;
  
  pfVar1 = fy_parse_eventp_alloc(fyp);
  if (pfVar1 == (fy_eventp *)0x0) {
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,0x1003,"fy_parse_empty_scalar","fy_eventp_alloc() failed!");
  }
  else {
    (pfVar1->e).type = FYET_SCALAR;
    (pfVar1->e).field_1.document_start.document_start = (fy_token *)0x0;
    (pfVar1->e).field_1.document_start.document_state = (fy_document_state *)0x0;
    (pfVar1->e).field_1.scalar.value = (fy_token *)0x0;
  }
  return pfVar1;
}

Assistant:

static struct fy_eventp *
fy_parse_empty_scalar(struct fy_parser *fyp) {
    struct fy_eventp *fyep;
    struct fy_event *fye;

    fyep = fy_parse_eventp_alloc(fyp);
    fyp_error_check(fyp, fyep, err_out,
                    "fy_eventp_alloc() failed!");
    fye = &fyep->e;

    fye->type = FYET_SCALAR;
    fye->scalar.anchor = NULL;
    fye->scalar.tag = NULL;
    fye->scalar.value = NULL;
    return fyep;
    err_out:
    return NULL;
}